

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pDrawCallBatchingTests.cpp
# Opt level: O2

Statistics *
deqp::gles2::Performance::anon_unknown_0::calculateStats
          (Statistics *__return_storage_ptr__,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *samples)

{
  unsigned_long uVar1;
  pointer puVar2;
  long lVar3;
  ulong uVar4;
  int i;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  double dVar14;
  
  puVar2 = (samples->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = (long)(samples->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_finish - (long)puVar2;
  uVar6 = lVar5 >> 3;
  uVar7 = 0;
  uVar4 = 0;
  if (0 < (int)uVar6) {
    uVar4 = uVar6 & 0xffffffff;
  }
  dVar14 = 0.0;
  for (; uVar4 != uVar7; uVar7 = uVar7 + 1) {
    uVar1 = puVar2[uVar7];
    auVar9._8_4_ = (int)(uVar1 >> 0x20);
    auVar9._0_8_ = uVar1;
    auVar9._12_4_ = 0x45300000;
    dVar14 = dVar14 + (auVar9._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
  }
  auVar10._8_4_ = (int)(lVar5 >> 0x23);
  auVar10._0_8_ = uVar6;
  auVar10._12_4_ = 0x45300000;
  dVar12 = (auVar10._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0);
  dVar14 = dVar14 / dVar12;
  dVar8 = 0.0;
  for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
    dVar13 = (((double)CONCAT44(0x45300000,(int)(puVar2[uVar6] >> 0x20)) - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)puVar2[uVar6]) - 4503599627370496.0)) - dVar14;
    dVar8 = dVar8 + dVar13 * dVar13;
  }
  dVar8 = dVar8 / dVar12;
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  lVar5 = (long)(samples->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_finish -
          (long)(samples->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_start;
  lVar3 = lVar5 >> 3;
  auVar11._8_4_ = (int)(lVar5 >> 0x23);
  auVar11._0_8_ = lVar3;
  auVar11._12_4_ = 0x45300000;
  __return_storage_ptr__->mean = dVar14;
  __return_storage_ptr__->standardDeviation = dVar8;
  __return_storage_ptr__->standardErrorOfMean =
       dVar8 / SQRT((auVar11._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0));
  return __return_storage_ptr__;
}

Assistant:

Statistics calculateStats (const vector<deUint64>& samples)
{
	double mean = 0.0;

	for (int i = 0; i < (int)samples.size(); i++)
		mean += (double)samples[i];

	mean /= (double)samples.size();

	double standardDeviation = 0.0;

	for (int i = 0; i < (int)samples.size(); i++)
	{
		double x = (double)samples[i];
		standardDeviation += (x - mean) * (x - mean);
	}

	standardDeviation /= (double)samples.size();
	standardDeviation = std::sqrt(standardDeviation);

	double standardErrorOfMean = standardDeviation / std::sqrt((double)samples.size());

	Statistics stats;

	stats.mean					= mean;
	stats.standardDeviation		= standardDeviation;
	stats.standardErrorOfMean	= standardErrorOfMean;

	return stats;
}